

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_key_encode_decode.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_a3d2::ARTKeyEncodeDecodeTest_EncodeTextC0014_Test::TestBody
          (ARTKeyEncodeDecodeTest_EncodeTextC0014_Test *this)

{
  undefined1 local_128 [8];
  key_encoder enc;
  ARTKeyEncodeDecodeTest_EncodeTextC0014_Test *this_local;
  
  enc.off = (size_t)this;
  unodb::key_encoder::key_encoder((key_encoder *)local_128);
  do_pad_test_large_string((key_encoder *)local_128,0xfffd,true);
  unodb::key_encoder::~key_encoder((key_encoder *)local_128);
  return;
}

Assistant:

UNODB_TEST(ARTKeyEncodeDecodeTest, EncodeTextC0014) {
  unodb::key_encoder enc;
  do_pad_test_large_string(enc, unodb::key_encoder::maxlen + 1, true);
}